

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
Vector_distances_in_diagram
          (Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,char *filename,
          size_t where_to_cut,uint dimension)

{
  uint uVar1;
  uint uVar2;
  allocator<char> local_c9;
  string local_c8;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_a8;
  allocator<char> local_79;
  string local_78;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_58;
  undefined1 local_40 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> intervals;
  uint dimension_local;
  size_t where_to_cut_local;
  char *filename_local;
  Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this_local;
  
  intervals.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._4_4_ = dimension;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&this->intervals);
  std::vector<double,_std::allocator<double>_>::vector(&this->sorted_vector_of_distances);
  this->where_to_cut = where_to_cut;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  uVar1 = intervals.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (uVar1 == uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file(&local_58,&local_78,-1,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_40,&local_58);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,filename,&local_c9);
    read_persistence_intervals_in_one_dimension_from_file
              (&local_a8,&local_c8,
               intervals.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_40,&local_a8);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
            (&this->intervals,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  compute_sorted_vector_of_distances_via_heap(this,where_to_cut);
  set_up_numbers_of_functions_for_vectorization_and_projections_to_reals(this);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  return;
}

Assistant:

Vector_distances_in_diagram<F>::Vector_distances_in_diagram(const char* filename, size_t where_to_cut,
                                                            unsigned dimension)
    : where_to_cut(where_to_cut) {
  std::vector<std::pair<double, double> > intervals;
  if (dimension == std::numeric_limits<unsigned>::max()) {
    intervals = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    intervals = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  this->intervals = intervals;
  this->compute_sorted_vector_of_distances_via_heap(where_to_cut);
  // this->compute_sorted_vector_of_distances_via_vector_sorting( where_to_cut );
  set_up_numbers_of_functions_for_vectorization_and_projections_to_reals();
}